

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImStrnicmp(char *str1,char *str2,size_t count)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  sVar2 = 0;
  while( true ) {
    if (count == sVar2) {
      return 0;
    }
    bVar1 = str2[sVar2];
    bVar3 = bVar1 & 0x5f;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar3 = bVar1;
    }
    bVar1 = str1[sVar2];
    bVar4 = bVar1 & 0x5f;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar4 = bVar1;
    }
    if ((int)(char)bVar3 - (int)(char)bVar4 != 0) break;
    if (bVar1 == 0) {
      return 0;
    }
    sVar2 = sVar2 + 1;
  }
  return (int)(char)bVar3 - (int)(char)bVar4;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = ImToUpper(*str2) - ImToUpper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}